

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall amrex::TagBoxArray::mapPeriodicRemoveDuplicates(TagBoxArray *this,Geometry *geom)

{
  Periodicity *period;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Periodicity PVar5;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> owner_mask;
  Box local_3cc;
  Array4<const_int> local_3b0;
  Array4<char> local_370;
  MFIter mfi;
  TagBoxArray tmp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         *)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  mfi.fabArray._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  TagBoxArray((TagBoxArray *)&tmp.super_FabArray<amrex::TagBox>,
              &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.boxarray,
              &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.distributionMap,
              (IntVect *)&mfi);
  local_370.p = *(char **)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  local_370.jstride._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       local_370.p;
  mfi.fabArray._0_4_ = (int)local_370.jstride;
  PVar5 = Geometry::periodicity(geom);
  local_3b0.p = PVar5.period.vect._0_8_;
  local_3b0.jstride._0_4_ = PVar5.period.vect[2];
  FabArray<amrex::TagBox>::ParallelCopy_nowait
            (&tmp.super_FabArray<amrex::TagBox>,&this->super_FabArray<amrex::TagBox>,0,0,1,
             (IntVect *)&mfi,(IntVect *)&local_370,(Periodicity *)&local_3b0,ADD,(CPC *)0x0,false);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         *)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  mfi.fabArray._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  OwnerMask((amrex *)&owner_mask,(FabArrayBase *)&tmp,period,(IntVect *)&mfi);
  MFIter::MFIter(&mfi,(FabArrayBase *)&tmp,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      FabArrayBase::fabbox
                (&local_3cc,(FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray),
                 ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[mfi.currentIndex]);
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
                (&local_370,&tmp.super_FabArray<amrex::TagBox>,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_3b0,
                 (FabArray<amrex::IArrayBox> *)
                 owner_mask._M_t.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&mfi);
      if (local_3cc.smallend.vect[2] <= local_3cc.bigend.vect[2]) {
        iVar1 = local_3cc.smallend.vect[2];
        do {
          iVar2 = local_3cc.smallend.vect[1];
          if (local_3cc.smallend.vect[1] <= local_3cc.bigend.vect[1]) {
            do {
              iVar3 = local_3cc.smallend.vect[0];
              if (local_3cc.smallend.vect[0] <= local_3cc.bigend.vect[0]) {
                do {
                  if (local_3b0.p
                      [((long)iVar2 - (long)local_3b0.begin.y) *
                       CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) +
                       (long)(iVar3 - local_3b0.begin.x) +
                       ((long)iVar1 - (long)local_3b0.begin.z) * local_3b0.kstride] == 0) {
                    *(undefined1 *)
                     ((long)(_func_int ***)local_370.p +
                     ((long)iVar1 - (long)local_370.begin.z) * local_370.kstride +
                     (long)(iVar3 - local_370.begin.x) +
                     ((long)iVar2 - (long)local_370.begin.y) *
                     CONCAT44(local_370.jstride._4_4_,(int)local_370.jstride)) = 0;
                  }
                  iVar3 = iVar3 + 1;
                } while (local_3cc.bigend.vect[0] + 1 != iVar3);
              }
              bVar4 = iVar2 != local_3cc.bigend.vect[1];
              iVar2 = iVar2 + 1;
            } while (bVar4);
          }
          bVar4 = iVar1 != local_3cc.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar4);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  FabArray<amrex::TagBox>::FabArray
            ((FabArray<amrex::TagBox> *)&mfi,&this->super_FabArray<amrex::TagBox>);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &PTR__FabArray_007508a8;
  FabArray<amrex::TagBox>::operator=
            (&this->super_FabArray<amrex::TagBox>,&tmp.super_FabArray<amrex::TagBox>);
  FabArray<amrex::TagBox>::operator=
            (&tmp.super_FabArray<amrex::TagBox>,(FabArray<amrex::TagBox> *)&mfi);
  FabArray<amrex::TagBox>::~FabArray((FabArray<amrex::TagBox> *)&mfi);
  if ((__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
      owner_mask._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
    (**(code **)(*(long *)owner_mask._M_t.
                          super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                          .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))();
  }
  FabArray<amrex::TagBox>::~FabArray(&tmp.super_FabArray<amrex::TagBox>);
  return;
}

Assistant:

void
TagBoxArray::mapPeriodicRemoveDuplicates (const Geometry& geom)
{
    BL_PROFILE("TagBoxArray::mapPRD");

    if (Gpu::inLaunchRegion())
    {
        // There is not atomicAdd for char.  So we have to use int.
        iMultiFab itag = amrex::cast<iMultiFab>(*this);
        iMultiFab tmp(boxArray(),DistributionMap(),1,nGrowVect());
        tmp.setVal(0);
        tmp.ParallelAdd(itag, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag =this->array(mfi);
            Array4<int const> const& tmptag = tmp.const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            amrex::ParallelFor(box,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (msk(i,j,k)) {
                    tag(i,j,k) = static_cast<char>(tmptag(i,j,k));
                } else {
                    tag(i,j,k) = TagBox::CLEAR;
                }
            });
        }
    }
    else
    {
        TagBoxArray tmp(boxArray(),DistributionMap(),nGrowVect()); // note that tmp is filled w/ CLEAR.
        tmp.ParallelAdd(*this, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag = tmp.array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            AMREX_LOOP_3D(box, i, j, k,
            {
                if (!msk(i,j,k)) tag(i,j,k) = TagBox::CLEAR;
            });
        }

        std::swap(*this, tmp);
    }
}